

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io,void *buf,PHYSFS_uint64 len)

{
  ZIPfileinfo *finfo_00;
  ZIPentry *pZVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  PHYSFS_sint64 PVar5;
  PHYSFS_uint64 local_60;
  PHYSFS_sint64 br;
  int rc;
  PHYSFS_uint32 before;
  PHYSFS_sint64 avail;
  PHYSFS_sint64 maxread;
  PHYSFS_sint64 retval;
  ZIPentry *entry;
  ZIPfileinfo *finfo;
  PHYSFS_uint64 len_local;
  void *buf_local;
  PHYSFS_Io *_io_local;
  
  finfo_00 = (ZIPfileinfo *)_io->opaque;
  pZVar1 = finfo_00->entry;
  maxread = 0;
  lVar4 = pZVar1->uncompressed_size - (ulong)finfo_00->uncompressed_position;
  avail = len;
  if (lVar4 < (long)len) {
    avail = lVar4;
  }
  if (avail == 0) {
    _io_local = (PHYSFS_Io *)0x0;
  }
  else {
    if (pZVar1->compression_method == 0) {
      maxread = zip_read_decrypt(finfo_00,buf,avail);
    }
    else {
      (finfo_00->stream).next_out = (uchar *)buf;
      (finfo_00->stream).avail_out = (uint)avail;
      do {
        if (avail <= maxread) break;
        uVar2 = (finfo_00->stream).total_out;
        if (((finfo_00->stream).avail_in == 0) &&
           (local_60 = pZVar1->compressed_size - (ulong)finfo_00->compressed_position,
           0 < (long)local_60)) {
          if (0x4000 < (long)local_60) {
            local_60 = 0x4000;
          }
          PVar5 = zip_read_decrypt(finfo_00,finfo_00->buffer,local_60);
          if (PVar5 < 1) break;
          finfo_00->compressed_position = (uint)PVar5 + finfo_00->compressed_position;
          (finfo_00->stream).next_in = finfo_00->buffer;
          (finfo_00->stream).avail_in = (uint)PVar5;
        }
        iVar3 = mz_inflate(&finfo_00->stream,2);
        iVar3 = zlib_err(iVar3);
        maxread = ((finfo_00->stream).total_out - (uVar2 & 0xffffffff)) + maxread;
      } while (iVar3 == 0);
    }
    if (0 < maxread) {
      finfo_00->uncompressed_position = (int)maxread + finfo_00->uncompressed_position;
    }
    _io_local = (PHYSFS_Io *)maxread;
  }
  return (PHYSFS_sint64)_io_local;
}

Assistant:

static PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io, void *buf, PHYSFS_uint64 len)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_sint64 retval = 0;
    PHYSFS_sint64 maxread = (PHYSFS_sint64) len;
    PHYSFS_sint64 avail = entry->uncompressed_size -
                          finfo->uncompressed_position;

    if (avail < maxread)
        maxread = avail;

    BAIL_IF_ERRPASS(maxread == 0, 0);    /* quick rejection. */

    if (entry->compression_method == COMPMETH_NONE)
        retval = zip_read_decrypt(finfo, buf, maxread);
    else
    {
        finfo->stream.next_out = buf;
        finfo->stream.avail_out = (uInt) maxread;

        while (retval < maxread)
        {
            const PHYSFS_uint32 before = (PHYSFS_uint32) finfo->stream.total_out;
            int rc;

            if (finfo->stream.avail_in == 0)
            {
                PHYSFS_sint64 br;

                br = entry->compressed_size - finfo->compressed_position;
                if (br > 0)
                {
                    if (br > ZIP_READBUFSIZE)
                        br = ZIP_READBUFSIZE;

                    br = zip_read_decrypt(finfo, finfo->buffer, (PHYSFS_uint64) br);
                    if (br <= 0)
                        break;

                    finfo->compressed_position += (PHYSFS_uint32) br;
                    finfo->stream.next_in = finfo->buffer;
                    finfo->stream.avail_in = (unsigned int) br;
                } /* if */
            } /* if */

            rc = zlib_err(inflate(&finfo->stream, Z_SYNC_FLUSH));
            retval += (finfo->stream.total_out - before);

            if (rc != Z_OK)
                break;
        } /* while */
    } /* else */

    if (retval > 0)
        finfo->uncompressed_position += (PHYSFS_uint32) retval;

    return retval;
}